

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O3

string * __thiscall
kratos::Sequence::wait_to_str_abi_cxx11_(string *__return_storage_ptr__,Sequence *this)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  char *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  ulong local_38 [2];
  ulong local_28;
  
  uVar1 = this->wait_low_;
  local_38[0] = (ulong)uVar1;
  uVar2 = this->wait_high_;
  if (uVar1 == 0 && uVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    if (uVar1 == uVar2) {
      this_00 = "##{0}";
      pcVar4 = (char *)0x5;
      sVar3 = 2;
    }
    else {
      this_00 = "##[{0}:{1}]";
      pcVar4 = (char *)0xb;
      sVar3 = 0x22;
      local_28 = (ulong)uVar2;
    }
    format_str.size_ = sVar3;
    format_str.data_ = pcVar4;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_38;
    fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)this_00,format_str,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Sequence::wait_to_str() const {
    if (wait_low_ == 0 && wait_high_ == 0)
        return "";
    else if (wait_low_ == wait_high_)
        return ::format("##{0}", wait_low_);
    else
        return ::format("##[{0}:{1}]", wait_low_, wait_high_);
}